

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.hpp
# Opt level: O1

void __thiscall
helics::TimeCoordinator::TimeCoordinator
          (TimeCoordinator *this,
          function<void_(const_helics::ActionMessage_&)> *userSendMessageFunction)

{
  _Manager_type p_Var1;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type local_20;
  
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_28 = (_Manager_type)0x0;
  local_20 = userSendMessageFunction->_M_invoker;
  p_Var1 = (userSendMessageFunction->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_38._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(userSendMessageFunction->super__Function_base)._M_functor;
    local_38._8_8_ =
         *(undefined8 *)((long)&(userSendMessageFunction->super__Function_base)._M_functor + 8);
    (userSendMessageFunction->super__Function_base)._M_manager = (_Manager_type)0x0;
    userSendMessageFunction->_M_invoker = (_Invoker_type)0x0;
    local_28 = p_Var1;
  }
  BaseTimeCoordinator::BaseTimeCoordinator
            (&this->super_BaseTimeCoordinator,
             (function<void_(const_helics::ActionMessage_&)> *)&local_38);
  if (local_28 != (_Manager_type)0x0) {
    (*local_28)((_Any_data *)&local_38,(_Any_data *)&local_38,__destroy_functor);
  }
  (this->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator =
       (_func_int **)&PTR__TimeCoordinator_004dc3e8;
  (this->upstream).next.internalTimeCode = -1;
  (this->upstream).Te.internalTimeCode = 0;
  (this->upstream).minDe.internalTimeCode = 0;
  (this->upstream).TeAlt.internalTimeCode = 0;
  (this->upstream).lastGrant.internalTimeCode = 0;
  (this->upstream).minFed = -2010000000;
  (this->upstream).minFedActual = -2010000000;
  (this->upstream).mTimeState = initialized;
  (this->upstream).hasData = false;
  (this->upstream).interrupted = false;
  (this->upstream).delayedTiming = false;
  (this->upstream).timingVersion = -2;
  (this->upstream).restrictionLevel = '\0';
  (this->upstream).timeoutCount = 0;
  (this->upstream).sequenceCounter = 0;
  (this->upstream).responseSequenceCounter = 0;
  (this->upstream).grantedIteration = 0;
  (this->total).next.internalTimeCode = -1;
  (this->total).Te.internalTimeCode = 0;
  (this->total).minDe.internalTimeCode = 0;
  (this->total).TeAlt.internalTimeCode = 0;
  (this->total).lastGrant.internalTimeCode = 0;
  (this->total).minFed = -2010000000;
  (this->total).minFedActual = -2010000000;
  (this->total).mTimeState = initialized;
  (this->total).hasData = false;
  (this->total).interrupted = false;
  (this->total).delayedTiming = false;
  (this->total).timingVersion = -2;
  (this->total).restrictionLevel = '\0';
  (this->total).timeoutCount = 0;
  (this->total).sequenceCounter = 0;
  (this->total).responseSequenceCounter = 0;
  (this->total).grantedIteration = 0;
  (this->lastSend).next.internalTimeCode = -1;
  (this->lastSend).TeAlt.internalTimeCode = 0;
  (this->lastSend).lastGrant.internalTimeCode = 0;
  (this->lastSend).Te.internalTimeCode = 0;
  (this->lastSend).minDe.internalTimeCode = 0;
  (this->lastSend).minFed = -2010000000;
  (this->lastSend).minFedActual = -2010000000;
  (this->lastSend).mTimeState = initialized;
  (this->lastSend).hasData = false;
  (this->lastSend).interrupted = false;
  (this->lastSend).delayedTiming = false;
  (this->lastSend).timingVersion = -2;
  (this->lastSend).restrictionLevel = '\0';
  (this->lastSend).timeoutCount = 0;
  (this->lastSend).sequenceCounter = 0;
  (this->lastSend).responseSequenceCounter = 0;
  (this->lastSend).grantedIteration = 0;
  (this->time_granted).internalTimeCode = -0x7fffffffffffffff;
  (this->time_requested).internalTimeCode = 0x7fffffffffffffff;
  (this->time_next).internalTimeCode = 0;
  (this->time_minminDe).internalTimeCode = 0;
  (this->time_minDe).internalTimeCode = 0;
  (this->time_allow).internalTimeCode = -0x7fffffffffffffff;
  (this->time_exec).internalTimeCode = 0x7fffffffffffffff;
  (this->time_message).internalTimeCode = 0x7fffffffffffffff;
  (this->time_value).internalTimeCode = 0x7fffffffffffffff;
  (this->time_grantBase).internalTimeCode = -0x7fffffffffffffff;
  (this->time_block).internalTimeCode = 0x7fffffffffffffff;
  (this->maxTime).internalTimeCode = 0x7fffffffffffffff;
  memset(&this->dependent_federates,0,0x98);
  (this->info).timeDelta.internalTimeCode = 1;
  (this->info).inputDelay.internalTimeCode = 0;
  (this->info).outputDelay.internalTimeCode = 0;
  (this->info).offset.internalTimeCode = 0;
  (this->info).period.internalTimeCode = 0;
  (this->info).wait_for_current_time_updates = false;
  (this->info).uninterruptible = false;
  (this->info).restrictive_time_policy = false;
  (this->info).event_triggered = false;
  (this->info).maxIterations = 0x32;
  this->currentRestrictionLevel = '\0';
  this->iterating = NO_ITERATIONS;
  this->hasInitUpdates = false;
  this->hasIterationData = false;
  this->needSendAll = false;
  this->triggered = false;
  this->globalTime = false;
  this->dynamicJoining = false;
  (this->iteration).super___atomic_base<int>._M_i = 0;
  return;
}

Assistant:

explicit TimeCoordinator(std::function<void(const ActionMessage&)> userSendMessageFunction):
        BaseTimeCoordinator(std::move(userSendMessageFunction))
    {
    }